

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

ssize_t filemgr_write_blocks(filemgr *file,void *buf,uint num_blocks,bid_t start_bid)

{
  int iVar1;
  _func_ssize_t_int_void_ptr_size_t_cs_off_t *p_Var2;
  fdb_status fVar3;
  undefined1 *dst_buf;
  ssize_t sVar4;
  ulong blocksize;
  undefined1 *puVar5;
  ulong __size;
  undefined1 auStack_48 [8];
  void *local_40;
  uint local_34;
  
  puVar5 = auStack_48;
  blocksize = (ulong)file->blocksize;
  __size = num_blocks * blocksize;
  if ((file->encryption).ops != (encryption_ops *)0x0) {
    if (__size < 0x1001) {
      puVar5 = auStack_48 + -(__size + 0xf & 0xfffffffffffffff0);
      dst_buf = puVar5;
    }
    else {
      local_40 = buf;
      local_34 = num_blocks;
      dst_buf = (undefined1 *)malloc(__size);
      buf = local_40;
      num_blocks = local_34;
    }
    if (dst_buf == (undefined1 *)0x0) {
      sVar4 = -8;
    }
    else {
      *(undefined8 *)(puVar5 + -8) = 0x118141;
      fVar3 = fdb_encrypt_blocks(&file->encryption,dst_buf,buf,blocksize,num_blocks,start_bid);
      if (0x1000 < __size) {
        *(undefined8 *)(puVar5 + -8) = 0x118154;
        free(dst_buf);
      }
      if (fVar3 == FDB_RESULT_SUCCESS) {
        iVar1 = file->fd;
        p_Var2 = file->ops->pwrite;
        *(undefined8 *)(puVar5 + -8) = 0x11817d;
        sVar4 = (*p_Var2)(iVar1,dst_buf,__size,blocksize * start_bid);
      }
      else {
        sVar4 = (ssize_t)fVar3;
      }
    }
    return sVar4;
  }
  sVar4 = (*file->ops->pwrite)(file->fd,buf,__size,blocksize * start_bid);
  return sVar4;
}

Assistant:

ssize_t filemgr_write_blocks(struct filemgr *file, void *buf, unsigned num_blocks, bid_t start_bid) {
    size_t blocksize = file->blocksize;
    cs_off_t offset = start_bid * blocksize;
    size_t nbytes = num_blocks * blocksize;
    if (file->encryption.ops == NULL) {
        return file->ops->pwrite(file->fd, buf, nbytes, offset);
    } else {
        uint8_t *encrypted_buf;
        if (nbytes > 4096)
            encrypted_buf = (uint8_t*)malloc(nbytes);
        else
            encrypted_buf = alca(uint8_t, nbytes); // most common case (writing single block)
        if (!encrypted_buf)
            return FDB_RESULT_ALLOC_FAIL;
        fdb_status status = fdb_encrypt_blocks(&file->encryption,
                                               encrypted_buf,
                                               buf,
                                               blocksize,
                                               num_blocks,
                                               start_bid);
        if (nbytes > 4096)
            free(encrypted_buf);
        if (status != FDB_RESULT_SUCCESS)
            return status;
        return file->ops->pwrite(file->fd, encrypted_buf, nbytes, offset);
    }
}